

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

NodePtr HighsHashTree<int,_HighsImplications::VarBound>::copy_recurse(NodePtr node)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  long *__dest;
  NodePtr NVar5;
  logic_error *this;
  long *plVar6;
  int i;
  long *plVar7;
  long lVar8;
  ulong uStack_30;
  
  switch((uint)node.ptrAndType & 7) {
  case 0:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected node type in empty in hash tree");
    goto LAB_002b126d;
  case 1:
    plVar6 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    __dest = (long *)operator_new(0x28);
    lVar2 = plVar6[1];
    lVar8 = plVar6[2];
    lVar3 = plVar6[3];
    *__dest = *plVar6;
    __dest[1] = lVar2;
    __dest[2] = lVar8;
    __dest[3] = lVar3;
    __dest[4] = plVar6[4];
    uStack_30 = 1;
    plVar7 = __dest;
    do {
      plVar4 = (long *)operator_new(0x20);
      plVar1 = (long *)*plVar6;
      lVar2 = plVar1[1];
      lVar8 = plVar1[2];
      lVar3 = plVar1[3];
      *plVar4 = *plVar1;
      plVar4[1] = lVar2;
      plVar4[2] = lVar8;
      plVar4[3] = lVar3;
      *plVar7 = (long)plVar4;
      plVar6 = (long *)*plVar6;
      plVar7 = plVar4;
    } while (*plVar6 != 0);
    break;
  case 2:
    __dest = (long *)operator_new(0xd8);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0xd8);
    uStack_30 = 2;
    break;
  case 3:
    __dest = (long *)operator_new(0x2d8);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x2d8);
    uStack_30 = 3;
    break;
  case 4:
    __dest = (long *)operator_new(0x4d8);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x4d8);
    uStack_30 = 4;
    break;
  case 5:
    __dest = (long *)operator_new(0x6d8);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x6d8);
    uStack_30 = 5;
    break;
  case 6:
    plVar6 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    lVar2 = *plVar6;
    __dest = (long *)operator_new((ulong)((int)POPCOUNT(lVar2) * 8 + 0x47U & 0xffffffc0));
    *__dest = *plVar6;
    uStack_30 = 6;
    for (lVar8 = 0; POPCOUNT(lVar2) != lVar8; lVar8 = lVar8 + 1) {
      NVar5 = copy_recurse((NodePtr)plVar6[lVar8 + 1]);
      __dest[lVar8 + 1] = NVar5.ptrAndType;
    }
    break;
  case 7:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected type in hash tree");
LAB_002b126d:
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (NodePtr)((ulong)__dest | uStack_30);
}

Assistant:

static NodePtr copy_recurse(NodePtr node) {
    switch (node.getType()) {
      case kEmpty:
        throw std::logic_error("Unexpected node type in empty in hash tree");
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();

        ListLeaf* copyLeaf = new ListLeaf(*leaf);

        ListNode* iter = &leaf->first;
        ListNode* copyIter = &copyLeaf->first;
        do {
          copyIter->next = new ListNode(*iter->next);
          iter = iter->next;
          copyIter = copyIter->next;
        } while (iter->next != nullptr);

        return copyLeaf;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return new InnerLeaf<1>(*leaf);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return new InnerLeaf<2>(*leaf);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return new InnerLeaf<3>(*leaf);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return new InnerLeaf<4>(*leaf);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        int size = branch->occupation.num_set();
        BranchNode* newBranch =
            (BranchNode*)::operator new(getBranchNodeSize(size));
        newBranch->occupation = branch->occupation;
        for (int i = 0; i < size; ++i)
          newBranch->child[i] = copy_recurse(branch->child[i]);

        return newBranch;
      }
      default:
        throw std::logic_error("Unexpected type in hash tree");
    }
  }